

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

void __thiscall
Catch::CumulativeReporterBase::testCaseEnded
          (CumulativeReporterBase *this,TestCaseStats *testCaseStats)

{
  long in_RSI;
  vector<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>,_std::allocator<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>_>_>
  *in_RDI;
  unique_ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>
  node;
  value_type *__x;
  value_type in_stack_ffffffffffffffe8;
  
  __x = (value_type *)&stack0xffffffffffffffe8;
  Detail::
  make_unique<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,Catch::CumulativeReporterBase::SectionNode>,Catch::TestCaseStats_const&>
            ((TestCaseStats *)in_stack_ffffffffffffffe8.m_ptr);
  Detail::
  unique_ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>
  ::operator->((unique_ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>
                *)__x);
  std::
  vector<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::SectionNode>_>_>
  ::push_back((vector<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::SectionNode>_>_>
               *)in_RDI,__x);
  std::
  vector<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>,_std::allocator<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>_>_>
  ::push_back(in_RDI,(value_type *)__x);
  std::__cxx11::string::operator=
            ((string *)
             (in_RDI[6].
              super__Vector_base<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>,_std::allocator<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start + 0x12),(string *)(in_RSI + 0x48));
  std::__cxx11::string::operator=
            ((string *)
             (in_RDI[6].
              super__Vector_base<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>,_std::allocator<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start + 0x16),(string *)(in_RSI + 0x68));
  Detail::
  unique_ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>
  ::~unique_ptr((unique_ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>
                 *)in_RDI);
  return;
}

Assistant:

void CumulativeReporterBase::testCaseEnded(
        TestCaseStats const& testCaseStats ) {
        auto node = Detail::make_unique<TestCaseNode>( testCaseStats );
        assert( m_sectionStack.size() == 0 );
        node->children.push_back( CATCH_MOVE(m_rootSection) );
        m_testCases.push_back( CATCH_MOVE(node) );

        assert( m_deepestSection );
        m_deepestSection->stdOut = testCaseStats.stdOut;
        m_deepestSection->stdErr = testCaseStats.stdErr;
    }